

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BooleanStateQueryVerifiers::GetBooleanVerifier::verifyBoolean4
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1
          ,bool reference2,bool reference3)

{
  ostringstream *this_00;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  StateQueryMemoryWriteGuard<unsigned_char[4]> boolVector4;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::
  StateQueryMemoryWriteGuard(&boolVector4);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,boolVector4.m_value);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    (&boolVector4,testCtx);
  if ((bVar3) &&
     (((((bool)boolVector4.m_value[0] != reference0 || ((bool)boolVector4.m_value[1] != reference1))
       || ((bool)boolVector4.m_value[2] != reference2)) ||
      ((bool)boolVector4.m_value[3] != reference3)))) {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected ");
    pcVar1 = "mapped_ == GL_FALSE";
    pcVar2 = "mapped_ == GL_FALSE";
    if (reference0) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    std::operator<<((ostream *)this_00,pcVar2 + 0xb);
    std::operator<<((ostream *)this_00," ");
    pcVar2 = "mapped_ == GL_FALSE";
    if (reference1) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    std::operator<<((ostream *)this_00,pcVar2 + 0xb);
    std::operator<<((ostream *)this_00," ");
    pcVar2 = "mapped_ == GL_FALSE";
    if (reference2) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    std::operator<<((ostream *)this_00,pcVar2 + 0xb);
    std::operator<<((ostream *)this_00," ");
    if (reference3) {
      pcVar1 = "mapped_ == GL_TRUE";
    }
    std::operator<<((ostream *)this_00,pcVar1 + 0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference1 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference2 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference3 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
	};

	if (boolVector4[0] != referenceAsGLBoolean[0] ||
		boolVector4[1] != referenceAsGLBoolean[1] ||
		boolVector4[2] != referenceAsGLBoolean[2] ||
		boolVector4[3] != referenceAsGLBoolean[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}